

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

seed_t lest::seed(text *opt,text *arg)

{
  bool bVar1;
  seed_t sVar2;
  time_t tVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  text local_60;
  text local_40;
  
  bVar1 = std::operator==(arg,"time");
  if (bVar1) {
    tVar3 = time((time_t *)0x0);
    sVar2 = (seed_t)tVar3;
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)arg);
    bVar1 = is_number(&local_40);
    std::__cxx11::string::_M_dispose();
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_e0,"expecting \'time\' or positive number with option \'",opt);
      std::operator+(&local_c0,&local_e0,"\', got \'");
      std::operator+(&local_a0,&local_c0,arg);
      std::operator+(&local_80,&local_a0,"\' (try option --help)");
      std::runtime_error::runtime_error(this,(string *)&local_80);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_60,(string *)arg);
    sVar2 = stoi(&local_60);
    std::__cxx11::string::_M_dispose();
  }
  return sVar2;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    // std::time_t: implementation dependent

    if ( arg == "time" )
        return static_cast<seed_t>( time( lest_nullptr ) );

    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}